

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O1

bool google::protobuf::internal::IsFieldTypeEligibleForFastParsing(FieldDescriptor *field)

{
  bool bVar1;
  CppStringType CVar2;
  OneofDescriptor *pOVar3;
  internal aiStack_18 [16];
  
  if ((field->type_ != '\v') || (bVar1 = FieldDescriptor::is_map_message_type(field), !bVar1)) {
    if ((field->field_0x3 & 1) != 0) {
      if ((field->field_0x1 & 0x10) == 0) {
        pOVar3 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar3 = (field->scope_).containing_oneof;
        if (pOVar3 == (OneofDescriptor *)0x0) {
          protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb31);
        }
      }
      if (pOVar3 == (OneofDescriptor *)0x0) {
LAB_00277154:
        protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb63);
      }
      if ((pOVar3->field_count_ == 1) && ((pOVar3->fields_->field_0x1 & 2) != 0)) {
        IsFieldTypeEligibleForFastParsing(aiStack_18);
        goto LAB_00277154;
      }
      if ((field->field_0x3 & 1) != 0) {
        return false;
      }
    }
    if (((field->options_->field_0)._impl_.weak_ == false) &&
       ((((field->type_ != '\f' && (field->type_ != '\t')) ||
         (CVar2 = FieldDescriptor::cpp_string_type(field), (CVar2 & ~kCord) == kView)) ||
        ((CVar2 == kCord && (bVar1 = FieldDescriptor::is_repeated(field), !bVar1)))))) {
      return field->number_ < 0x800;
    }
  }
  return false;
}

Assistant:

bool IsFieldTypeEligibleForFastParsing(const FieldDescriptor* field) {
  // Map, oneof, weak, and split fields are not handled on the fast path.
  if (field->is_map() || field->real_containing_oneof() ||
      field->options().weak()) {
    return false;
  }

  switch (field->type()) {
      // Some bytes fields can be handled on fast path.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      auto ctype = field->cpp_string_type();
      if (ctype == FieldDescriptor::CppStringType::kString ||
          ctype == FieldDescriptor::CppStringType::kView) {
        // strings are fine...
      } else if (ctype == FieldDescriptor::CppStringType::kCord) {
        // Cords are worth putting into the fast table, if they're not repeated
        if (field->is_repeated()) return false;
      } else {
        return false;
      }
      break;
    }

    default:
      break;
  }

  // The largest tag that can be read by the tailcall parser is two bytes
  // when varint-coded. This allows 14 bits for the numeric tag value:
  //   byte 0   byte 1
  //   1nnnnttt 0nnnnnnn
  //    ^^^^^^^  ^^^^^^^
  if (field->number() >= 1 << 11) return false;

  return true;
}